

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O3

unique_ptr<verilogAST::File,_std::default_delete<verilogAST::File>_> __thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::File,_std::default_delete<verilogAST::File>_> *node)

{
  long lVar1;
  long *in_RDX;
  pointer puVar2;
  pointer puVar3;
  vector<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  new_modules;
  _Head_base<0UL,_verilogAST::AbstractModule_*,_false> local_80;
  vector<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  local_78;
  long *local_58;
  _Head_base<0UL,_verilogAST::File_*,_false> local_50;
  vector<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  local_48;
  
  local_78.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  local_78.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
  local_78.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_78.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_78.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar1 = *in_RDX;
  puVar2 = *(pointer *)(lVar1 + 8);
  puVar3 = *(pointer *)(lVar1 + 0x10);
  if (puVar2 == puVar3) {
    local_78.
    super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    local_58 = in_RDX;
    local_50._M_head_impl = (File *)this;
    do {
      local_80._M_head_impl =
           (puVar2->_M_t).
           super___uniq_ptr_impl<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>
           ._M_t.
           super__Tuple_impl<0UL,_verilogAST::AbstractModule_*,_std::default_delete<verilogAST::AbstractModule>_>
           .super__Head_base<0UL,_verilogAST::AbstractModule_*,_false>._M_head_impl;
      (puVar2->_M_t).
      super___uniq_ptr_impl<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>
      ._M_t.
      super__Tuple_impl<0UL,_verilogAST::AbstractModule_*,_std::default_delete<verilogAST::AbstractModule>_>
      .super__Head_base<0UL,_verilogAST::AbstractModule_*,_false>._M_head_impl =
           (AbstractModule *)0x0;
      (**(code **)&(node->_M_t).
                   super___uniq_ptr_impl<verilogAST::File,_std::default_delete<verilogAST::File>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_verilogAST::File_*,_std::default_delete<verilogAST::File>_>
                   .super__Head_base<0UL,_verilogAST::File_*,_false>._M_head_impl[10].modules.
                   super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
                   ._M_impl)(&local_48,node,&local_80);
      std::
      vector<std::unique_ptr<verilogAST::AbstractModule,std::default_delete<verilogAST::AbstractModule>>,std::allocator<std::unique_ptr<verilogAST::AbstractModule,std::default_delete<verilogAST::AbstractModule>>>>
      ::
      emplace_back<std::unique_ptr<verilogAST::AbstractModule,std::default_delete<verilogAST::AbstractModule>>>
                ((vector<std::unique_ptr<verilogAST::AbstractModule,std::default_delete<verilogAST::AbstractModule>>,std::allocator<std::unique_ptr<verilogAST::AbstractModule,std::default_delete<verilogAST::AbstractModule>>>>
                  *)&local_78,
                 (unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>
                  *)&local_48);
      if (local_48.
          super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(((local_48.
                       super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                     super___uniq_ptr_impl<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_verilogAST::AbstractModule_*,_std::default_delete<verilogAST::AbstractModule>_>
                     .super__Head_base<0UL,_verilogAST::AbstractModule_*,_false>._M_head_impl + 0x10
                    ))();
      }
      local_48.
      super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      if (local_80._M_head_impl != (AbstractModule *)0x0) {
        (**(code **)(*(long *)local_80._M_head_impl + 0x10))();
      }
      local_80._M_head_impl = (AbstractModule *)0x0;
      puVar2 = puVar2 + 1;
    } while (puVar2 != puVar3);
    lVar1 = *local_58;
    puVar2 = *(pointer *)(lVar1 + 8);
    puVar3 = *(pointer *)(lVar1 + 0x10);
    this = (Transformer *)local_50._M_head_impl;
    in_RDX = local_58;
  }
  local_48.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)(lVar1 + 0x18);
  *(undefined4 *)(lVar1 + 8) =
       local_78.
       super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start._0_4_;
  *(undefined4 *)(lVar1 + 0xc) =
       local_78.
       super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start._4_4_;
  *(undefined4 *)(lVar1 + 0x10) =
       local_78.
       super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish._0_4_;
  *(undefined4 *)(lVar1 + 0x14) =
       local_78.
       super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish._4_4_;
  *(pointer *)(lVar1 + 0x18) =
       local_78.
       super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_78.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = puVar2;
  local_48.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar3;
  std::
  vector<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  ::~vector(&local_48);
  *this = (Transformer)*in_RDX;
  *in_RDX = 0;
  std::
  vector<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  ::~vector(&local_78);
  return (__uniq_ptr_data<verilogAST::File,_std::default_delete<verilogAST::File>,_true,_true>)
         (tuple<verilogAST::File_*,_std::default_delete<verilogAST::File>_>)this;
}

Assistant:

std::unique_ptr<File> Transformer::visit(std::unique_ptr<File> node) {
  std::vector<std::unique_ptr<AbstractModule>> new_modules;
  for (auto&& item : node->modules) {
    new_modules.push_back(this->visit(std::move(item)));
  }
  node->modules = std::move(new_modules);
  return node;
}